

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_fpu_helper.c
# Opt level: O3

void vfll32(S390Vector *v1,S390Vector *v2,CPUS390XState_conflict *env,_Bool s,uintptr_t retaddr)

{
  bool bVar1;
  byte bVar2;
  float64 fVar3;
  long lVar4;
  undefined7 in_register_00000009;
  float64 *pfVar5;
  bool bVar6;
  uint8_t vec_exc;
  byte local_55;
  undefined4 local_54;
  float64 local_50;
  uintptr_t local_48;
  S390Vector *local_40;
  float64 local_38;
  
  local_54 = (undefined4)CONCAT71(in_register_00000009,s);
  local_55 = 0;
  lVar4 = 0;
  pfVar5 = &local_38;
  local_38 = 0;
  local_50 = 0;
  bVar6 = true;
  local_48 = retaddr;
  local_40 = v1;
  while( true ) {
    fVar3 = float32_to_float64_s390x(*(float32 *)((long)v2 + lVar4 * 4 + 4),&env->fpu_status);
    *pfVar5 = fVar3;
    bVar2 = check_ieee_exc(env,(uint8_t)lVar4,false,&local_55);
    if (((char)local_54 != '\0') || (bVar2 != 0)) break;
    lVar4 = 2;
    pfVar5 = &local_50;
    bVar1 = !bVar6;
    bVar6 = false;
    if (bVar1) {
LAB_00cd9896:
      if (local_55 != 0) {
        env->fpc = env->fpc | (uint)local_55 << 0x10;
      }
      local_40->doubleword[0] = local_38;
      local_40->doubleword[1] = local_50;
      return;
    }
  }
  if (bVar2 != 0) {
    tcg_s390_vector_exception(env,(uint)bVar2,local_48);
  }
  goto LAB_00cd9896;
}

Assistant:

static void vfll32(S390Vector *v1, const S390Vector *v2, CPUS390XState *env,
                   bool s, uintptr_t retaddr)
{
    uint8_t vxc, vec_exc = 0;
    S390Vector tmp = { 0 };
    int i;

    for (i = 0; i < 2; i++) {
        /* load from even element */
        const float32 a = s390_vec_read_element32(v2, i * 2);
        const uint64_t ret = float32_to_float64(a, &env->fpu_status);

        s390_vec_write_element64(&tmp, i, ret);
        /* indicate the source element */
        vxc = check_ieee_exc(env, i * 2, false, &vec_exc);
        if (s || vxc) {
            break;
        }
    }
    handle_ieee_exc(env, vxc, vec_exc, retaddr);
    *v1 = tmp;
}